

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall
xLearn::RMSDMetric::Accumulate
          (RMSDMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
  *f;
  reference pvVar4;
  ThreadPool *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t end_idx;
  size_t start_idx;
  int i;
  vector<float,_std::allocator<float>_> sum;
  allocator_type *in_stack_fffffffffffffe48;
  unsigned_long *__args_3;
  Logger *in_stack_fffffffffffffe50;
  vector<float,_std::allocator<float>_> *this_00;
  vector<float,_std::allocator<float>_> **__args_1;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe60;
  _func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_float_ptr_unsigned_long_unsigned_long
  *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe78;
  ThreadPool *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  int line;
  allocator *paVar5;
  LogSeverity severity;
  ulong local_118;
  ThreadPool *this_01;
  int local_a4;
  undefined1 local_9d [36];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  ThreadPool *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  
  line = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_18);
  if (sVar1 != sVar2) {
    Logger::Logger(&local_1c,ERR);
    paVar5 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
               ,paVar5);
    severity = (LogSeverity)((ulong)paVar5 >> 0x20);
    paVar5 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Accumulate",paVar5);
    poVar3 = Logger::Start(severity,(string *)paVar5,line,in_stack_fffffffffffffeb8);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x315);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"Y.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar1 = std::vector<float,_std::allocator<float>_>::size(local_10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"pred.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffe50);
    abort();
  }
  sVar1 = std::vector<float,_std::allocator<float>_>::size(local_10);
  *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + (int)sVar1;
  this_00 = *(vector<float,_std::allocator<float>_> **)(in_RDI + 0x10);
  local_9d._1_4_ = 0;
  __args_1 = (vector<float,_std::allocator<float>_> **)local_9d;
  std::allocator<float>::allocator((allocator<float> *)0x1f6af4);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe60,(size_type)__args_1,(value_type_conflict *)this_00,
             in_stack_fffffffffffffe48);
  std::allocator<float>::~allocator((allocator<float> *)0x1f6b22);
  for (local_a4 = 0; (ulong)(long)local_a4 < *(ulong *)(in_RDI + 0x10); local_a4 = local_a4 + 1) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_18);
    getStart(sVar1,*(size_t *)(in_RDI + 0x10),(long)local_a4);
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_18);
    getEnd(sVar1,*(size_t *)(in_RDI + 0x10),(long)local_a4);
    __args_3 = *(unsigned_long **)(in_RDI + 8);
    this_01 = local_18;
    f = (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
         *)std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(local_9d + 5),(long)local_a4);
    std::
    bind<void(&)(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long),std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long&,unsigned_long&>
              (in_stack_fffffffffffffe68,
               (vector<float,_std::allocator<float>_> **)in_stack_fffffffffffffe60,__args_1,
               (float **)this_00,__args_3,(unsigned_long *)in_stack_fffffffffffffe80);
    ThreadPool::
    enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
              (this_01,f);
    std::future<void>::~future((future<void> *)0x1f6c67);
  }
  ThreadPool::Sync(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  local_118 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(local_9d + 5));
    if (sVar1 <= local_118) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_9d + 5),local_118);
    *(float *)(in_RDI + 0x18) = *pvVar4 + *(float *)(in_RDI + 0x18);
    local_118 = local_118 + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<real_t> sum(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(rmsd_accum_thread,
                               &Y,
                               &pred,
                               &(sum[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum.size(); ++i) {
      error_ += sum[i];
    }
  }